

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-vm.c
# Opt level: O1

_Bool bindMethod(ObjClass *klass,ObjString *name)

{
  _Bool _Var1;
  ulong in_RAX;
  ObjBoundMethod *pOVar2;
  Value method;
  ulong local_18;
  
  local_18 = in_RAX;
  _Var1 = tableGet(&klass->methods,name,&local_18);
  if (_Var1) {
    pOVar2 = newBoundMethod(vm.stackTop[-1],(ObjClosure *)(local_18 & 0x3ffffffffffff));
    vm.stackTop[-1] = (ulong)pOVar2 | 0xfffc000000000000;
  }
  else {
    runtimeError("Undefined property \'%s\'.",name->chars);
  }
  return _Var1;
}

Assistant:

static bool bindMethod(ObjClass* klass, ObjString* name) {
    Value method;
    if (!tableGet(&klass->methods, name, &method)) {
        runtimeError("Undefined property '%s'.", name->chars);
        return false;
    }

    ObjBoundMethod* bound = newBoundMethod(peek(0), AS_CLOSURE(method));
    pop();
    push(OBJ_VAL(bound));
    return true;
}